

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall QFileDialogPrivate::navigateBackward(QFileDialogPrivate *this)

{
  pointer pHVar1;
  long lVar2;
  
  if (((this->currentHistory).d.size != 0) && (0 < this->currentHistoryLocation)) {
    saveHistorySelection(this);
    lVar2 = (long)this->currentHistoryLocation + -1;
    this->currentHistoryLocation = (int)lVar2;
    pHVar1 = QList<QFileDialogPrivate::HistoryItem>::data(&this->currentHistory);
    navigate(this,pHVar1 + lVar2);
    return;
  }
  return;
}

Assistant:

constexpr bool isEmpty() const noexcept { return size() == 0; }